

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish.cpp
# Opt level: O0

int __thiscall ncnn::Mish::forward_inplace(Mish *this,Mat *bottom_top_blob,Option *opt)

{
  float __x;
  float *pfVar1;
  long in_RSI;
  float fVar2;
  double dVar3;
  float y;
  float x;
  float MISH_THRESHOLD;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  float local_9c;
  int local_90;
  int in_stack_ffffffffffffff74;
  Mat *in_stack_ffffffffffffff78;
  Mat local_80;
  float *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = *(int *)(in_RSI + 0x2c);
  local_20 = *(int *)(in_RSI + 0x30);
  local_24 = *(int *)(in_RSI + 0x38);
  local_28 = local_1c * local_20;
  for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
    ncnn::Mat::channel(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    pfVar1 = ncnn::Mat::operator_cast_to_float_(&local_80);
    ncnn::Mat::~Mat((Mat *)0x8edff3);
    local_38 = pfVar1;
    for (local_90 = 0; local_90 < local_28; local_90 = local_90 + 1) {
      __x = local_38[local_90];
      local_9c = __x;
      if (__x <= 20.0) {
        if (-20.0 <= __x) {
          fVar2 = expf(__x);
          local_9c = logf(fVar2 + 1.0);
        }
        else {
          local_9c = expf(__x);
        }
      }
      dVar3 = std::tanh((double)(ulong)(uint)local_9c);
      local_38[local_90] = __x * SUB84(dVar3,0);
    }
  }
  return 0;
}

Assistant:

int Mish::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            const float MISH_THRESHOLD = 20;
            float x = ptr[i], y;
            if (x > MISH_THRESHOLD)
                y = x;
            else if (x < -MISH_THRESHOLD)
                y = expf(x);
            else
                y = logf(expf(x) + 1);
            ptr[i] = static_cast<float>(x * tanh(y));
        }
    }

    return 0;
}